

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

OBJ_AFFECT_DATA * new_affect_obj(void)

{
  OBJ_AFFECT_DATA *pOVar1;
  
  if (oaffect_free == (OBJ_AFFECT_DATA *)0x0) {
    pOVar1 = (OBJ_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    pOVar1 = oaffect_free;
    oaffect_free = oaffect_free->next;
  }
  pOVar1->valid = false;
  pOVar1->field_0x11 = 0;
  pOVar1->where = 0;
  pOVar1->type = 0;
  pOVar1->level = 0;
  pOVar1->duration = 0;
  pOVar1->location = 0;
  pOVar1->modifier = 0;
  *(undefined2 *)&pOVar1->field_0x1e = 0;
  pOVar1->tick_fun = (OAFF_FUN *)0x0;
  pOVar1->end_fun = (OAFF_FUN *)0x0;
  *(undefined8 *)&pOVar1->aftype = 0;
  pOVar1->pulse_fun = (OAFF_FUN *)0x0;
  pOVar1->bitvector[0] = 0;
  pOVar1->bitvector[1] = 0;
  pOVar1->next = (OBJ_AFFECT_DATA *)0x0;
  pOVar1->owner = (CHAR_DATA *)0x0;
  pOVar1->valid = true;
  return pOVar1;
}

Assistant:

OBJ_AFFECT_DATA *new_affect_obj(void)
{
	static OBJ_AFFECT_DATA af_zero;
	OBJ_AFFECT_DATA *af;

	if (oaffect_free == nullptr)
	{
		af = new OBJ_AFFECT_DATA;
	}
	else
	{
		af = oaffect_free;
		oaffect_free = oaffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}